

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O0

RegexStats * __thiscall
UnifiedRegex::RegexStatsDatabase::GetRegexStats(RegexStatsDatabase *this,RegexPattern *pattern)

{
  bool bVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar2;
  RegexStats *this_00;
  TrackAllocData local_58;
  RegexStats *local_30;
  RegexStats *res;
  InternalString str;
  RegexPattern *pattern_local;
  RegexStatsDatabase *this_local;
  
  str.m_content.ptr = (char16_t *)pattern;
  RegexPattern::GetSource((RegexPattern *)&res);
  bVar1 = JsUtil::
          BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<Js::InternalString>(this->map,(InternalString *)&res,&local_30);
  if (!bVar1) {
    pAVar2 = &this->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&RegexStats::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexStats.cpp"
               ,0xad);
    pAVar2 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar2,&local_58);
    this_00 = (RegexStats *)new<Memory::ArenaAllocator>(0x80,(ArenaAllocator *)pAVar2,0x3f67b0);
    RegexStats::RegexStats(this_00,(RegexPattern *)str.m_content.ptr);
    local_30 = this_00;
    JsUtil::
    BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(this->map,(InternalString *)&res,&local_30);
  }
  return local_30;
}

Assistant:

RegexStats* RegexStatsDatabase::GetRegexStats(RegexPattern* pattern)
    {
        Js::InternalString str = pattern->GetSource();
        RegexStats *res;
        if (!map->TryGetValue(str, &res))
        {
            res = Anew(allocator, RegexStats, pattern);
            map->Add(str, res);
        }
        return res;
    }